

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpServer::TcpServer
          (TcpServer *this,SocketFactory *sf,io_context *io_context,string *address,uint16_t portNum
          ,bool port_reuse,int nominalBufferSize)

{
  bool bVar1;
  undefined1 uVar2;
  query *in_RCX;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *in_RDX;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int in_stack_00000008;
  iterator end;
  TcpServer *in_stack_000000e0;
  iterator endpoint_iterator;
  query query;
  resolver resolver;
  basic_resolver_entry<asio::ip::tcp> *in_stack_fffffffffffffdc8;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  protocol_type *in_stack_fffffffffffffdf8;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffe00;
  query *q;
  basic_resolver<asio::ip::tcp,_asio::any_io_executor> *this_00;
  
  q = in_RCX;
  this_00 = in_RDX;
  std::enable_shared_from_this<gmlc::networking::TcpServer>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpServer> *)0x703e5b);
  *(basic_resolver<asio::ip::tcp,_asio::any_io_executor> **)(in_RDI + 0x10) = in_RDX;
  SocketFactory::SocketFactory
            ((SocketFactory *)in_stack_fffffffffffffdd0,(SocketFactory *)in_stack_fffffffffffffdc8);
  std::mutex::mutex((mutex *)0x703e96);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
            *)0x703eac);
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ::vector((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
            *)0x703ec2);
  *(long *)(in_RDI + 0x88) = (long)in_stack_00000008;
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
              *)in_stack_fffffffffffffdd0);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
            *)in_stack_fffffffffffffdd0);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_fffffffffffffdd0);
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_fffffffffffffdd0,
             SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
  *(byte *)(in_RDI + 0xf1) = in_R9B & 1;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::vector((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
            *)0x703f63);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8), bVar1))
  {
    asio::ip::address_v4::any();
    std::
    vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
    ::emplace_back<asio::ip::address_v4,unsigned_short&>
              (in_stack_fffffffffffffde0,
               (address_v4 *)
               CONCAT17(in_stack_fffffffffffffddf,
                        CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
               (unsigned_short *)in_stack_fffffffffffffdd0);
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    if ((bool)uVar2) {
      asio::ip::tcp::v4();
      std::
      vector<asio::ip::basic_endpoint<asio::ip::tcp>,std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>>>
      ::emplace_back<asio::ip::tcp,unsigned_short&>
                (in_stack_fffffffffffffde0,
                 (tcp *)CONCAT17(in_stack_fffffffffffffddf,
                                 CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                 (unsigned_short *)in_stack_fffffffffffffdd0);
    }
    else {
      asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::
      basic_resolver<asio::io_context>
                ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)
                 CONCAT17(uVar2,in_stack_fffffffffffffdf0),(io_context *)in_stack_fffffffffffffde8,
                 (constraint_t<is_convertible<io_context_&,_execution_context_&>::value>)
                 ((ulong)in_stack_fffffffffffffde0 >> 0x20));
      asio::ip::tcp::v4();
      CLI::std::__cxx11::to_string(in_R8D);
      asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                 (string *)CONCAT17(uVar2,in_stack_fffffffffffffdf0),in_stack_fffffffffffffde8,
                 (flags)((ulong)in_RCX >> 0x20));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffdd0);
      asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve(this_00,q);
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
                ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdd0,
                 (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdc8);
      asio::ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
                ((basic_resolver_results<asio::ip::tcp> *)0x704130);
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator
                ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdd0);
      bVar1 = asio::ip::operator!=
                        ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdd0,
                         (basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdc8);
      if (bVar1) {
        while (bVar1 = asio::ip::operator!=
                                 ((basic_resolver_iterator<asio::ip::tcp> *)
                                  in_stack_fffffffffffffdd0,
                                  (basic_resolver_iterator<asio::ip::tcp> *)
                                  in_stack_fffffffffffffdc8), bVar1) {
          in_stack_fffffffffffffdc8 = (basic_resolver_entry<asio::ip::tcp> *)(in_RDI + 0x70);
          in_stack_fffffffffffffdd0 =
               (basic_resolver_query<asio::ip::tcp> *)
               asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator*
                         ((basic_resolver_iterator<asio::ip::tcp> *)0x7041ae);
          asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint(in_stack_fffffffffffffdc8)
          ;
          std::
          vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
          ::push_back((vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
                       *)in_stack_fffffffffffffdd0,&in_stack_fffffffffffffdc8->endpoint_);
          asio::ip::basic_resolver_iterator<asio::ip::tcp>::operator++
                    ((basic_resolver_iterator<asio::ip::tcp> *)in_stack_fffffffffffffdd0);
        }
        bVar1 = false;
      }
      else {
        std::atomic<bool>::operator=
                  ((atomic<bool> *)in_stack_fffffffffffffdd0,
                   SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
        bVar1 = true;
      }
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
                ((basic_resolver_iterator<asio::ip::tcp> *)0x7042ea);
      asio::ip::basic_resolver_iterator<asio::ip::tcp>::~basic_resolver_iterator
                ((basic_resolver_iterator<asio::ip::tcp> *)0x7042f7);
      asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query
                (in_stack_fffffffffffffdd0);
      asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::~basic_resolver
                ((basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)in_stack_fffffffffffffdd0);
      if (bVar1) {
        return;
      }
    }
  }
  initialConnect(in_stack_000000e0);
  return;
}

Assistant:

TcpServer::TcpServer(
    const SocketFactory& sf,
    asio::io_context& io_context,
    const std::string& address,
    uint16_t portNum,
    bool port_reuse,
    int nominalBufferSize) :
    ioctx(io_context), socket_factory(sf), bufferSize(nominalBufferSize),
    reuse_address(port_reuse)
{
    if ((address == "*") || (address == "tcp://*")) {
        endpoints.emplace_back(asio::ip::address_v4::any(), portNum);
        //      endpoints.emplace_back (asio::ip::address_v6::any (), portNum);
    } else if (address == "localhost") {
        endpoints.emplace_back(asio::ip::tcp::v4(), portNum);
    } else {
        tcp::resolver resolver(io_context);
        tcp::resolver::query query(
            tcp::v4(),
            address,
            std::to_string(portNum),
            tcp::resolver::query::canonical_name);
        tcp::resolver::iterator endpoint_iterator = resolver.resolve(query);
        tcp::resolver::iterator end;
        if (endpoint_iterator != end) {
            while (endpoint_iterator != end) {
                endpoints.push_back(*endpoint_iterator);
                ++endpoint_iterator;
            }
        } else {
            halted = true;
            return;
        }
    }
    initialConnect();
}